

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePartFunction<duckdb::interval_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  undefined1 *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  long *plVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var12;
  sel_t *psVar13;
  byte bVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  reference vector;
  reference vector_00;
  long lVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  SelectionVector *pSVar19;
  _Head_base<0UL,_unsigned_long_*,_false> _Var20;
  long lVar21;
  ulong uVar22;
  SelectionVector *pSVar23;
  SelectionVector *pSVar24;
  data_ptr_t pdVar25;
  idx_t idx_in_entry;
  SelectionVector *count;
  data_ptr_t pdVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  UnifiedVectorFormat ldata;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar5 = (long *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      lVar17 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                         (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                          *(undefined8 *)vector_00->data,*(undefined8 *)(vector_00->data + 8));
      *plVar5 = lVar17;
      return;
    }
  }
  else {
    count = (SelectionVector *)args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar6 = vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar26 = local_c8.data;
          pSVar24 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar1 < (undefined1 *)0x40) {
              return;
            }
            uVar22 = 0;
            pSVar24 = (SelectionVector *)0x0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
LAB_00ed6fee:
                pSVar23 = pSVar24;
                if (pSVar24 < pSVar19) {
                  uVar10 = *(undefined8 *)pdVar6;
                  uVar11 = *(undefined8 *)(pdVar6 + 8);
                  pdVar26 = pdVar25 + (long)pSVar24 * 0x10 + 8;
                  do {
                    lVar17 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (*(undefined8 *)(pdVar26 + -8),*(undefined8 *)pdVar26,uVar10,
                                        uVar11);
                    *(long *)(pdVar7 + (long)pSVar24 * 8) = lVar17;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    pdVar26 = pdVar26 + 0x10;
                    pSVar23 = pSVar19;
                  } while (pSVar19 != pSVar24);
                }
              }
              else {
                uVar29 = puVar4[uVar22];
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
                pSVar23 = pSVar19;
                if (uVar29 != 0) {
                  if (uVar29 == 0xffffffffffffffff) goto LAB_00ed6fee;
                  pSVar23 = pSVar24;
                  if (pSVar24 < pSVar19) {
                    pdVar26 = pdVar25 + (long)pSVar24 * 0x10 + 8;
                    uVar27 = 0;
                    do {
                      if ((uVar29 >> (uVar27 & 0x3f) & 1) != 0) {
                        lVar17 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                           (*(undefined8 *)(pdVar26 + -8),*(undefined8 *)pdVar26,
                                            *(undefined8 *)pdVar6,*(undefined8 *)(pdVar6 + 8));
                        *(long *)(pdVar7 + uVar27 * 8 + (long)pSVar24 * 8) = lVar17;
                      }
                      uVar27 = uVar27 + 1;
                      pdVar26 = pdVar26 + 0x10;
                      pSVar23 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar24 != uVar27);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              pSVar24 = pSVar23;
              if (uVar22 == (ulong)puVar1 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar10 = *(undefined8 *)pdVar6;
        uVar11 = *(undefined8 *)(pdVar6 + 8);
        pdVar25 = pdVar25 + 8;
        pSVar24 = (SelectionVector *)0x0;
        do {
          lVar17 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                             (*(undefined8 *)(pdVar25 + -8),*(undefined8 *)pdVar25,uVar10,uVar11);
          *(long *)(pdVar7 + (long)pSVar24 * 8) = lVar17;
          pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
          pdVar25 = pdVar25 + 0x10;
        } while (count != pSVar24);
        return;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,(idx_t)count,&local_c8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != (SelectionVector *)0x0) {
              _Var12._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar13 = (local_78.sel)->sel_vector;
              pSVar24 = (SelectionVector *)0x0;
              do {
                pSVar19 = pSVar24;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var12._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar19 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var12._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar24 * 4);
                }
                pSVar23 = pSVar24;
                if (psVar13 != (sel_t *)0x0) {
                  pSVar23 = (SelectionVector *)(ulong)psVar13[(long)pSVar24];
                }
                uVar11._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar19 * 0x10))->_M_use_count;
                uVar11._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar19 * 0x10))->_M_weak_count;
                lVar17 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar19 * 0x10))->_vptr__Sp_counted_base,
                                    uVar11,*(undefined8 *)(local_78.data + (long)pSVar23 * 0x10),
                                    *(undefined8 *)(local_78.data + (long)pSVar23 * 0x10 + 8));
                *(long *)(pdVar6 + (long)pSVar24 * 8) = lVar17;
                pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
              } while (count != pSVar24);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            _Var12._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_c8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar13 = (local_78.sel)->sel_vector;
            pSVar24 = (SelectionVector *)0x0;
            do {
              pSVar19 = pSVar24;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var12._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar19 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var12._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar24 * 4);
              }
              pSVar23 = pSVar24;
              if (psVar13 != (sel_t *)0x0) {
                pSVar23 = (SelectionVector *)(ulong)psVar13[(long)pSVar24];
              }
              if (((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar19 >> 6] >> ((ulong)pSVar19 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar23 >> 6] >> ((ulong)pSVar23 & 0x3f) & 1) != 0)))) {
                uVar10._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar19 * 0x10))->_M_use_count;
                uVar10._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)local_c8.data + pSVar19 * 0x10))->_M_weak_count;
                lVar17 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                   (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    ((long)local_c8.data + pSVar19 * 0x10))->_vptr__Sp_counted_base,
                                    uVar10,*(undefined8 *)(local_78.data + (long)pSVar23 * 0x10),
                                    *(undefined8 *)(local_78.data + (long)pSVar23 * 0x10 + 8));
                *(long *)(pdVar6 + (long)pSVar24 * 8) = lVar17;
              }
              else {
                _Var20._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var20._M_head_impl == (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var16 = p_Stack_e0;
                  peVar15 = local_e8;
                  local_e8 = (element_type *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar15;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var16;
                  if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var20._M_head_impl =
                       (pTVar18->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var20._M_head_impl;
                }
                bVar14 = (byte)pSVar24 & 0x3f;
                _Var20._M_head_impl[(ulong)pSVar24 >> 6] =
                     _Var20._M_head_impl[(ulong)pSVar24 >> 6] &
                     (-2L << bVar14 | 0xfffffffffffffffeU >> 0x40 - bVar14);
              }
              pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
            } while (count != pSVar24);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
          return;
        }
        pdVar6 = vector->data;
        pdVar25 = vector_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        this = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_78);
          pdVar26 = local_c8.data;
          pSVar24 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            FlatVector::VerifyFlatVector(vector_00);
            ValidityMask::Combine(this,&vector_00->validity,(idx_t)count);
            _Var20._M_head_impl = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            goto LAB_00ed77f7;
          }
        }
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          _Var20._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar26 = local_c8.data;
          pSVar24 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var20._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var20._M_head_impl;
LAB_00ed77f7:
        if (_Var20._M_head_impl == (unsigned_long *)0x0) {
          if (count != (SelectionVector *)0x0) {
            lVar17 = 0;
            do {
              lVar21 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                 (*(undefined8 *)(pdVar6 + lVar17 * 2),
                                  *(undefined8 *)(pdVar6 + lVar17 * 2 + 8),
                                  *(undefined8 *)(pdVar25 + lVar17 * 2),
                                  *(undefined8 *)(pdVar25 + lVar17 * 2 + 8));
              *(long *)(pdVar7 + lVar17) = lVar21;
              lVar17 = lVar17 + 8;
              count = (SelectionVector *)
                      ((long)&count[-1].selection_data.internal.
                              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 7);
            } while (count != (SelectionVector *)0x0);
          }
        }
        else {
          puVar1 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar1) {
            uVar22 = 0;
            pSVar24 = (SelectionVector *)0x0;
            do {
              puVar4 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
LAB_00ed785c:
                pSVar23 = pSVar24;
                if (pSVar24 < pSVar19) {
                  uVar29 = (long)pSVar24 << 4 | 8;
                  do {
                    lVar17 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (*(undefined8 *)(pdVar6 + (uVar29 - 8)),
                                        *(undefined8 *)(pdVar6 + uVar29),
                                        *(undefined8 *)(pdVar25 + (uVar29 - 8)),
                                        *(undefined8 *)(pdVar25 + uVar29));
                    *(long *)(pdVar7 + (long)pSVar24 * 8) = lVar17;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    uVar29 = uVar29 + 0x10;
                    pSVar23 = pSVar19;
                  } while (pSVar19 != pSVar24);
                }
              }
              else {
                uVar29 = puVar4[uVar22];
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
                pSVar23 = pSVar19;
                if (uVar29 != 0) {
                  if (uVar29 == 0xffffffffffffffff) goto LAB_00ed785c;
                  pSVar23 = pSVar24;
                  if (pSVar24 < pSVar19) {
                    uVar28 = (long)pSVar24 << 4 | 8;
                    uVar27 = 0;
                    do {
                      if ((uVar29 >> (uVar27 & 0x3f) & 1) != 0) {
                        lVar17 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                           (*(undefined8 *)(pdVar6 + (uVar28 - 8)),
                                            *(undefined8 *)(pdVar6 + uVar28),
                                            *(undefined8 *)(pdVar25 + (uVar28 - 8)),
                                            *(undefined8 *)(pdVar25 + uVar28));
                        *(long *)(pdVar7 + uVar27 * 8 + (long)pSVar24 * 8) = lVar17;
                      }
                      uVar27 = uVar27 + 1;
                      uVar28 = uVar28 + 0x10;
                      pSVar23 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar24 != uVar27);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              pSVar24 = pSVar23;
            } while (uVar22 != (ulong)puVar1 >> 6);
          }
        }
        return;
      }
      pdVar6 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar25 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.sel = count;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
        }
        else {
          local_78.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_78);
          pdVar26 = local_c8.data;
          pSVar24 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar24;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar26;
          if ((p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var9.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if (puVar1 < (undefined1 *)0x40) {
              return;
            }
            uVar22 = 0;
            pSVar24 = (SelectionVector *)0x0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
LAB_00ed7324:
                pSVar23 = pSVar24;
                if (pSVar24 < pSVar19) {
                  uVar10 = *(undefined8 *)pdVar6;
                  uVar11 = *(undefined8 *)(pdVar6 + 8);
                  pdVar26 = pdVar25 + (long)pSVar24 * 0x10 + 8;
                  do {
                    lVar17 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                       (uVar10,uVar11,*(undefined8 *)(pdVar26 + -8),
                                        *(undefined8 *)pdVar26);
                    *(long *)(pdVar7 + (long)pSVar24 * 8) = lVar17;
                    pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
                    pdVar26 = pdVar26 + 0x10;
                    pSVar23 = pSVar19;
                  } while (pSVar19 != pSVar24);
                }
              }
              else {
                uVar29 = puVar4[uVar22];
                pSVar19 = (SelectionVector *)
                          &pSVar24[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar19) {
                  pSVar19 = count;
                }
                pSVar23 = pSVar19;
                if (uVar29 != 0) {
                  if (uVar29 == 0xffffffffffffffff) goto LAB_00ed7324;
                  pSVar23 = pSVar24;
                  if (pSVar24 < pSVar19) {
                    pdVar26 = pdVar25 + (long)pSVar24 * 0x10 + 8;
                    uVar27 = 0;
                    do {
                      if ((uVar29 >> (uVar27 & 0x3f) & 1) != 0) {
                        lVar17 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                                           (*(undefined8 *)pdVar6,*(undefined8 *)(pdVar6 + 8),
                                            *(undefined8 *)(pdVar26 + -8),*(undefined8 *)pdVar26);
                        *(long *)(pdVar7 + uVar27 * 8 + (long)pSVar24 * 8) = lVar17;
                      }
                      uVar27 = uVar27 + 1;
                      pdVar26 = pdVar26 + 0x10;
                      pSVar23 = pSVar19;
                    } while ((long)pSVar19 - (long)pSVar24 != uVar27);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              pSVar24 = pSVar23;
              if (uVar22 == (ulong)puVar1 >> 6) {
                return;
              }
            } while( true );
          }
        }
        if (count == (SelectionVector *)0x0) {
          return;
        }
        uVar10 = *(undefined8 *)pdVar6;
        uVar11 = *(undefined8 *)(pdVar6 + 8);
        pdVar25 = pdVar25 + 8;
        pSVar24 = (SelectionVector *)0x0;
        do {
          lVar17 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::DatePartFunction<duckdb::interval_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::interval_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::interval_t,long>
                             (uVar10,uVar11,*(undefined8 *)(pdVar25 + -8),*(undefined8 *)pdVar25);
          *(long *)(pdVar7 + (long)pSVar24 * 8) = lVar17;
          pSVar24 = (SelectionVector *)((long)&pSVar24->sel_vector + 1);
          pdVar25 = pdVar25 + 0x10;
        } while (count != pSVar24);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}